

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte_node.cpp
# Opt level: O1

bool __thiscall duckdb::CTENode::Equals(CTENode *this,QueryNode *other_p)

{
  bool bVar1;
  int iVar2;
  CTENode *pCVar3;
  pointer pQVar4;
  undefined8 extraout_RDX;
  
  bVar1 = QueryNode::Equals(&this->super_QueryNode,other_p);
  if (bVar1) {
    if (this == (CTENode *)other_p) {
      return true;
    }
    pCVar3 = QueryNode::Cast<duckdb::CTENode>(other_p);
    pQVar4 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                       (&this->query);
    iVar2 = (*pQVar4->_vptr_QueryNode[4])
                      (pQVar4,(pCVar3->query).
                              super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                              .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl);
    if ((char)iVar2 != '\0') {
      pQVar4 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
               operator->(&this->child);
      iVar2 = (*pQVar4->_vptr_QueryNode[4])
                        (pQVar4,(pCVar3->child).
                                super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                                .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl,
                         extraout_RDX,pQVar4->_vptr_QueryNode[4]);
      return SUB41(iVar2,0);
    }
  }
  return false;
}

Assistant:

bool CTENode::Equals(const QueryNode *other_p) const {
	if (!QueryNode::Equals(other_p)) {
		return false;
	}
	if (this == other_p) {
		return true;
	}
	auto &other = other_p->Cast<CTENode>();

	if (!query->Equals(other.query.get())) {
		return false;
	}
	if (!child->Equals(other.child.get())) {
		return false;
	}
	return true;
}